

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

bool __thiscall
Assimp::X3DImporter::FindNodeElement
          (X3DImporter *this,string *pID,EType pType,CX3DImporter_NodeElement **pElement)

{
  size_t __n;
  bool bVar1;
  bool bVar2;
  int iVar3;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar4;
  CX3DImporter_NodeElement *pCVar5;
  _List_node_base *p_Var6;
  
  pCVar5 = this->NodeElement_Cur;
  while( true ) {
    if (pCVar5 == (CX3DImporter_NodeElement *)0x0) {
      bVar2 = FindNodeElement_FromRoot(this,pID,pType,pElement);
      return bVar2;
    }
    if ((pCVar5->Type == ENET_Group) &&
       (*(char *)&pCVar5[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_prev != '\0')) break;
    pCVar5 = pCVar5->Parent;
  }
  if (((pCVar5->Type == pType) &&
      (__n = (pCVar5->ID)._M_string_length, __n == pID->_M_string_length)) &&
     ((__n == 0 ||
      (iVar3 = bcmp((pCVar5->ID)._M_dataplus._M_p,(pID->_M_dataplus)._M_p,__n), iVar3 == 0)))) {
    bVar2 = true;
    if (pElement != (CX3DImporter_NodeElement **)0x0) {
      *pElement = pCVar5;
    }
  }
  else {
    plVar4 = &pCVar5->Child;
    p_Var6 = (_List_node_base *)plVar4;
    do {
      p_Var6 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      bVar2 = p_Var6 != (_List_node_base *)plVar4;
      if (p_Var6 == (_List_node_base *)plVar4) {
        return bVar2;
      }
      bVar1 = FindNodeElement_FromNode
                        (this,(CX3DImporter_NodeElement *)p_Var6[1]._M_next,pID,pType,pElement);
    } while (!bVar1);
  }
  return bVar2;
}

Assistant:

bool X3DImporter::FindNodeElement(const std::string& pID, const CX3DImporter_NodeElement::EType pType, CX3DImporter_NodeElement** pElement)
{
    CX3DImporter_NodeElement* tnd = NodeElement_Cur;// temporary pointer to node.
    bool static_search = false;// flag: true if searching in static node.

    // At first check if we have deal with static node. Go up through parent nodes and check flag.
    while(tnd != nullptr)
    {
		if(tnd->Type == CX3DImporter_NodeElement::ENET_Group)
		{
			if(((CX3DImporter_NodeElement_Group*)tnd)->Static)
			{
				static_search = true;// Flag found, stop walking up. Node with static flag will holded in tnd variable.
				break;
			}
		}

		tnd = tnd->Parent;// go up in graph.
    }// while(tnd != nullptr)

    // at now call appropriate search function.
    if ( static_search )
    {
        return FindNodeElement_FromNode( tnd, pID, pType, pElement );
    }
    else
    {
        return FindNodeElement_FromRoot( pID, pType, pElement );
    }
}